

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O2

int ndn_data_parse_encrypted_content
              (ndn_data_t *data,uint8_t *payload_value,uint32_t *payload_used_size,
              ndn_name_t *key_name)

{
  int iVar1;
  uint32_t aes_key_id;
  uint32_t input_size;
  uint8_t *input;
  undefined1 local_40 [8];
  ndn_decoder_t decoder;
  
  decoder.input_value._0_4_ = data->content_size;
  local_40 = (undefined1  [8])data->content_value;
  decoder.input_value._4_4_ = 0;
  iVar1 = ndn_name_tlv_decode((ndn_decoder_t *)local_40,key_name);
  if (iVar1 == 0) {
    input_size = (uint32_t)decoder.input_value - decoder.input_value._4_4_;
    input = (uint8_t *)((long)local_40 + (ulong)decoder.input_value._4_4_);
    aes_key_id = key_id_from_key_name(key_name);
    iVar1 = ndn_parse_encrypted_payload(input,input_size,payload_value,payload_used_size,aes_key_id)
    ;
  }
  return iVar1;
}

Assistant:

int
ndn_data_parse_encrypted_content(const ndn_data_t* data, uint8_t* payload_value, uint32_t* payload_used_size,
                                 ndn_name_t* key_name)
{
  int ret_val = -1;
  ndn_decoder_t decoder;
  decoder_init(&decoder, data->content_value, data->content_size);

  // type: TLV_NAME
  ret_val = ndn_name_tlv_decode(&decoder, key_name);
  if (ret_val != NDN_SUCCESS) return ret_val;

  ret_val = ndn_parse_encrypted_payload(decoder.input_value + decoder.offset, decoder.input_size - decoder.offset,
                                        payload_value, payload_used_size, key_id_from_key_name(key_name));
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}